

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

value * mjs::to_primitive(value *__return_storage_ptr__,value *v,value_type hint)

{
  bool bVar1;
  value_type vVar2;
  object_ptr *p;
  object *poVar3;
  wchar_t *pwVar4;
  to_primitive_failed_error *this;
  vector<mjs::value,_std::allocator<mjs::value>_> local_a8;
  byte local_85;
  int local_84;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_80;
  undefined1 local_70 [8];
  value fo;
  wchar_t *id;
  int i;
  undefined1 local_30 [8];
  object_ptr o;
  value_type hint_local;
  value *v_local;
  value *res;
  
  o.super_gc_heap_ptr_untyped._12_4_ = hint;
  vVar2 = value::type(v);
  if (vVar2 == object) {
    p = value::object_value(v);
    gc_heap_ptr<mjs::object>::gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_30,p);
    if (o.super_gc_heap_ptr_untyped._12_4_ == 0) {
      poVar3 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_30);
      o.super_gc_heap_ptr_untyped._12_4_ = (*poVar3->_vptr_object[3])();
    }
    if (o.super_gc_heap_ptr_untyped._12_4_ != 3 && o.super_gc_heap_ptr_untyped._12_4_ != 4) {
      __assert_fail("hint == value_type::number || hint == value_type::string",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                    ,0x7c,"value mjs::to_primitive(const value &, value_type)");
    }
    id._0_4_ = 0;
    while( true ) {
      if (1 < (int)(uint)id) {
        this = (to_primitive_failed_error *)__cxa_allocate_exception(8);
        to_primitive_failed_error::to_primitive_failed_error(this);
        __cxa_throw(this,&to_primitive_failed_error::typeinfo,
                    to_primitive_failed_error::~to_primitive_failed_error);
      }
      pwVar4 = L"valueOf";
      if ((o.super_gc_heap_ptr_untyped._12_4_ == 4) != (uint)id) {
        pwVar4 = L"toString";
      }
      fo.field_1._24_8_ = pwVar4;
      poVar3 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_30);
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                (&local_80,(wchar_t *)fo.field_1._24_8_);
      (**poVar3->_vptr_object)(local_70,poVar3,&local_80);
      vVar2 = value::type((value *)local_70);
      if (vVar2 == object) {
        local_85 = 0;
        local_a8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_a8);
        call_function(__return_storage_ptr__,(value *)local_70,v,&local_a8);
        std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_a8);
        vVar2 = value::type(__return_storage_ptr__);
        bVar1 = is_primitive(vVar2);
        if (bVar1) {
          local_85 = 1;
          local_84 = 1;
        }
        else {
          local_84 = 4;
        }
        if ((local_85 & 1) == 0) {
          value::~value(__return_storage_ptr__);
        }
      }
      else {
        local_84 = 4;
      }
      value::~value((value *)local_70);
      if (local_84 != 4) break;
      id._0_4_ = (uint)id + 1;
    }
    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_30);
  }
  else {
    value::value(__return_storage_ptr__,v);
  }
  return __return_storage_ptr__;
}

Assistant:

value to_primitive(const value& v, value_type hint) {
    if (v.type() != value_type::object) {
        return v;
    }

    auto o = v.object_value();

    // [[DefaultValue]] (Hint)
    if (hint == value_type::undefined) {
        // When hint is undefined, assume Number unless it's a Date object in which case assume String
        hint = o->default_value_type();
    }

    assert(hint == value_type::number || hint == value_type::string);
    for (int i = 0; i < 2; ++i) {
        const wchar_t* const id = (hint == value_type::string) ^ i ? L"toString" : L"valueOf";
        const auto fo = o->get(id);
        if (fo.type() != value_type::object) {
            continue;
        }
        auto res = call_function(fo, v, {});
        if (!is_primitive(res.type())) {
            continue;
        }
        return res;
    }

    throw to_primitive_failed_error{};
}